

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

int gimage::getViewImageName(string *image,char *name,char *spath,bool verbose)

{
  _Base_ptr *pp_Var1;
  pointer pcVar2;
  void *pvVar3;
  pointer pbVar4;
  pointer pbVar5;
  undefined1 *puVar6;
  _Base_ptr p_Var7;
  int iVar8;
  ImageIO *pIVar9;
  long *plVar10;
  ulong *puVar11;
  ostream *poVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 *puVar15;
  iterator iVar16;
  _Base_ptr p_Var17;
  undefined7 in_register_00000009;
  size_type *psVar18;
  long *plVar19;
  ulong *puVar20;
  long lVar21;
  char cVar22;
  long lVar23;
  ulong *puVar24;
  _Base_ptr p_Var25;
  ulong *puVar26;
  _Base_ptr p_Var27;
  ulong uVar28;
  pointer pbVar29;
  bool bVar30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  long w;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  int d;
  long h;
  int dd;
  string s;
  string depthname;
  long dh;
  int dd_1;
  long dw;
  long h_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flist;
  allocator_type local_2c1;
  ulong *local_2c0;
  ulong *local_2b8;
  string *local_2b0;
  undefined4 local_2a4;
  string local_2a0;
  char *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  undefined4 local_25c;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  key_type local_238;
  ulong local_218;
  undefined8 local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  long local_188;
  int local_17c;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  undefined2 uStack_120;
  undefined6 uStack_11e;
  _Rb_tree_node_base *local_118;
  size_t local_110;
  _Rb_tree_node_base local_108;
  _Rb_tree_node_base local_e8;
  _Rb_tree_node_base local_c8;
  _Rb_tree_node_base local_a8;
  _Rb_tree_node_base local_88;
  _Rb_tree_node_base local_68;
  
  local_2a4 = (undefined4)CONCAT71(in_register_00000009,verbose);
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0 = image;
  std::__cxx11::string::string((string *)local_138,name,(allocator *)&local_1b8);
  gutil::split((vector *)&local_278,(string *)local_138,',',true);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  local_2b0->_M_string_length = 0;
  *(local_2b0->_M_dataplus)._M_p = '\0';
  local_2b8 = (ulong *)0x0;
  if (0x20 < (ulong)((long)local_278.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_278.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar28 = 1;
    local_2b8 = (ulong *)0x0;
    lVar23 = 0x20;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((long)&((local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar23,0,(char *)0x2);
      if (iVar8 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_138,
                   (long)&((local_278.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar23);
        std::__cxx11::string::operator=((string *)local_2b0,(string *)local_138);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_);
        }
        local_2b8 = (ulong *)0x1;
      }
      uVar28 = uVar28 + 1;
      lVar23 = lVar23 + 0x20;
    } while (uVar28 < (ulong)((long)local_278.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_278.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_2b0->_M_string_length == 0) {
    local_1b8._M_impl._0_8_ = &local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = ((local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    lVar23 = std::__cxx11::string::find_last_of((char *)&local_1b8,0x12f633,0xffffffffffffffff);
    if ((ulong)(CONCAT44(local_1b8._M_impl.super__Rb_tree_header._M_header._4_4_,
                         local_1b8._M_impl.super__Rb_tree_header._M_header._M_color) - (lVar23 + 1))
        < 9) {
      bVar30 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_68._M_right,(ulong)&local_1b8);
      iVar8 = std::__cxx11::string::compare((char *)&local_68._M_right);
      bVar30 = iVar8 == 0;
      if (local_68._M_right != (_Base_ptr)&stack0xffffffffffffffc0) {
        operator_delete(local_68._M_right);
      }
    }
    if (bVar30) {
      pIVar9 = getImageIO();
      ImageIO::loadHeader(pIVar9,(char *)local_1b8._M_impl._0_8_,(long *)&local_178,&local_188,
                          (int *)&local_210);
      _uStack_120 = local_138 + 8;
      local_138._8_8_ = (ulong)(uint)local_138._12_4_ << 0x20;
      local_138._16_8_ = (_Base_ptr)0x0;
      local_110 = 0;
      local_280 = spath;
      local_118 = (_Rb_tree_node_base *)_uStack_120;
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_1b8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_238.field_2._M_allocated_capacity = *psVar18;
        local_238.field_2._8_8_ = plVar10[3];
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar18;
        local_238._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_238._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_238,local_238._M_string_length,0,'\x01');
      psVar18 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_2a0.field_2._M_allocated_capacity = *psVar18;
        local_2a0.field_2._8_8_ = plVar10[3];
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      }
      else {
        local_2a0.field_2._M_allocated_capacity = *psVar18;
        local_2a0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_2a0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      pp_Var1 = &local_208._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar19 = plVar10 + 2;
      if ((_Base_ptr *)*plVar10 == (_Base_ptr *)plVar19) {
        local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
        local_208._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar10[3];
        local_208._M_impl._0_8_ = pp_Var1;
      }
      else {
        local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar19;
        local_208._M_impl._0_8_ = (_Base_ptr *)*plVar10;
      }
      local_208._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
      gutil::getFileList((set *)local_138,(string *)&local_208,(string *)local_158);
      if (local_158[0] != local_148) {
        operator_delete(local_158[0]);
      }
      if ((_Base_ptr *)local_208._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_208._M_impl._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258);
      }
      if ((_Rb_tree_node_base *)_uStack_120 != (_Rb_tree_node_base *)(local_138 + 8)) {
        pp_Var1 = &local_208._M_impl.super__Rb_tree_header._M_header._M_parent;
        uVar13 = _uStack_120;
        do {
          local_208._M_impl._0_8_ = pp_Var1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,*(long *)(uVar13 + 0x20),
                     (long)&((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_parent->_M_color +
                     *(long *)(uVar13 + 0x20));
          pIVar9 = getImageIO();
          ImageIO::loadHeader(pIVar9,(char *)local_208._M_impl._0_8_,(long *)&local_2a0,
                              (long *)&local_238,(int *)&local_258);
          puVar11 = (ulong *)((long)(local_2a0._M_dataplus._M_p + (long)local_178 + -1) /
                             (long)local_178);
          lVar23 = (long)(int)puVar11;
          if (((ulong *)((long)(local_2a0._M_dataplus._M_p + lVar23 + -1) / lVar23) == local_178) &&
             ((long)(local_238._M_dataplus._M_p + lVar23 + -1) / lVar23 == local_188)) {
            if ((char)local_2a4 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Found suitable image: ",0x16);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)local_208._M_impl._0_8_,
                                   local_208._M_impl.super__Rb_tree_header._M_header._0_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
            }
            if ((int)local_210 == 1) {
              std::__cxx11::string::_M_assign((string *)local_2b0);
              local_210._0_4_ = (int)local_258;
              local_2b8 = puVar11;
            }
          }
          if ((_Base_ptr *)local_208._M_impl._0_8_ != pp_Var1) {
            operator_delete((void *)local_208._M_impl._0_8_);
          }
          uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13);
        } while ((_Rb_tree_node_base *)uVar13 != (_Rb_tree_node_base *)(local_138 + 8));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      spath = local_280;
    }
    if ((_Base_ptr *)local_1b8._M_impl._0_8_ !=
        &local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_1b8._M_impl._0_8_);
    }
  }
  if (local_2b0->_M_string_length == 0) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    pcVar2 = ((local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,
               pcVar2 + (local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    uVar28 = std::__cxx11::string::rfind((char)&local_2a0,0x3a);
    if (uVar28 == 0xffffffffffffffff) {
      local_25c = 0;
    }
    else {
      uVar13 = std::__cxx11::string::compare((ulong)&local_2a0,uVar28,(char *)0x2);
      local_25c = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),(int)uVar13 != 0);
    }
    pIVar9 = getImageIO();
    ImageIO::loadHeader(pIVar9,local_2a0._M_dataplus._M_p,&local_188,&local_210,&local_17c);
    pbVar5 = local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_17c = 0;
    pbVar29 = local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pcVar2 = (pbVar29->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &pbVar29->field_2) {
          operator_delete(pcVar2);
        }
        pbVar29 = pbVar29 + 1;
      } while (pbVar29 != pbVar5);
      local_278.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    getPrefixAlternatives(&local_278,&local_2a0,spath);
    if ((local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) && (local_2b0->_M_string_length == 0)) {
      local_280 = (char *)CONCAT44(local_280._4_4_,0xffffffff);
      local_218 = 0;
      do {
        pbVar4 = local_278.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1b8._M_impl.super__Rb_tree_header._M_header;
        local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
        gutil::getFileList((set *)&local_1b8,(string *)(pbVar4 + local_218),(string *)local_138);
        if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_);
        }
        local_208._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_208._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_208._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_208._M_impl.super__Rb_tree_header._M_header;
        local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_208._M_impl.super__Rb_tree_header._M_header._M_right =
             local_208._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_208,&local_2a0);
        for (p_Var17 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var17 != &local_1b8._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          if ((char)local_25c != '\0') {
            std::__cxx11::string::find_last_of((char *)&local_238,0x12f633,0xffffffffffffffff);
            cVar22 = (char)&local_238;
            uVar28 = std::__cxx11::string::find(cVar22,0x5f);
            if ((uVar28 != 0xffffffffffffffff) &&
               (uVar14 = std::__cxx11::string::rfind(cVar22,0x5f), uVar28 < uVar14)) {
              std::__cxx11::string::substr((ulong)local_158,(ulong)&local_238);
              plVar10 = (long *)std::__cxx11::string::append((char *)local_158);
              local_258 = &local_248;
              puVar11 = (ulong *)(plVar10 + 2);
              if ((ulong *)*plVar10 == puVar11) {
                local_248 = *puVar11;
                lStack_240 = plVar10[3];
              }
              else {
                local_248 = *puVar11;
                local_258 = (ulong *)*plVar10;
              }
              local_250 = plVar10[1];
              *plVar10 = (long)puVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_238);
              uVar28 = 0xf;
              if (local_258 != &local_248) {
                uVar28 = local_248;
              }
              if (uVar28 < (ulong)(local_170 + local_250)) {
                uVar28 = 0xf;
                if (local_178 != local_168) {
                  uVar28 = local_168[0];
                }
                if (uVar28 < (ulong)(local_170 + local_250)) goto LAB_0011f4a7;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_178,0,(char *)0x0,(ulong)local_258);
              }
              else {
LAB_0011f4a7:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_178);
              }
              local_138._0_8_ = local_138 + 0x10;
              pcVar2 = (pointer)(puVar15 + 2);
              if ((pointer)*puVar15 == pcVar2) {
                local_138._16_8_ = *(undefined8 *)pcVar2;
                _uStack_120 = puVar15[3];
              }
              else {
                local_138._16_8_ = *(undefined8 *)pcVar2;
                local_138._0_8_ = (pointer)*puVar15;
              }
              local_138._8_8_ = puVar15[1];
              *puVar15 = pcVar2;
              puVar15[1] = 0;
              *pcVar2 = '\0';
              std::__cxx11::string::operator=((string *)&local_238,(string *)local_138);
              if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                operator_delete((void *)local_138._0_8_);
              }
              if (local_178 != local_168) {
                operator_delete(local_178);
              }
              if (local_258 != &local_248) {
                operator_delete(local_258);
              }
              if (local_158[0] != local_148) {
                operator_delete(local_158[0]);
              }
            }
          }
          iVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_208,&local_238);
          if ((((_Rb_tree_header *)iVar16._M_node == &local_208._M_impl.super__Rb_tree_header) &&
              (iVar8 = std::__cxx11::string::compare
                                 ((ulong)&local_238,local_238._M_string_length - 4,(char *)0x4),
              iVar8 != 0)) &&
             (iVar8 = std::__cxx11::string::compare
                                ((ulong)&local_238,local_238._M_string_length - 4,(char *)0x4),
             iVar8 != 0)) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_208,&local_238);
            pIVar9 = getImageIO();
            ImageIO::loadHeader(pIVar9,local_238._M_dataplus._M_p,(long *)&local_258,
                                (long *)local_158,(int *)&local_178);
            puVar11 = (ulong *)(((long)local_258 + local_188 + -1) / local_188);
            lVar23 = (long)(int)puVar11;
            if ((((long)local_258 + lVar23 + -1) / lVar23 == local_188) &&
               ((long)(local_158[0] + lVar23 + -1) / lVar23 ==
                CONCAT44(local_210._4_4_,(int)local_210))) {
              if ((char)local_2a4 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Found suitable image: ",0x16);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                                     local_238._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
              }
              std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&local_238);
              lVar23 = local_1d0;
              puVar6 = local_1d8;
              if (local_1d0 != 0) {
                lVar21 = 0;
                do {
                  iVar8 = tolower((int)(char)puVar6[lVar21]);
                  puVar6[lVar21] = (char)iVar8;
                  lVar21 = lVar21 + 1;
                } while (lVar23 != lVar21);
              }
              if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                   whitelist_abi_cxx11_ == '\0') &&
                 (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               getTextureNameRating(std::__cxx11::string)::
                                               whitelist_abi_cxx11_), iVar8 != 0)) {
                local_138._0_8_ = local_138 + 0x10;
                local_138._16_8_ = (_Base_ptr)0x7469736e65746e69;
                local_138._8_8_ = 9;
                uStack_120 = 0x79;
                local_118 = &local_108;
                local_108._M_color._2_1_ = 0x67;
                local_108._M_color._0_2_ = 0x6d69;
                local_110 = 3;
                local_108._M_color._3_1_ = _S_red >> 0x18;
                local_108._M_left = &local_e8;
                local_e8._4_1_ = 0x65;
                local_e8._M_color = 0x67616d69;
                local_108._M_right = (_Base_ptr)0x5;
                local_e8._5_1_ = 0;
                local_e8._M_left = &local_c8;
                local_c8._M_color = 0x6f6e6f6d;
                local_e8._M_right = (_Base_ptr)0x4;
                local_c8._4_1_ = 0;
                local_c8._M_left = &local_a8;
                local_a8._4_1_ = 0x72;
                local_a8._M_color = 0x6f6c6f63;
                local_c8._M_right = (_Base_ptr)0x5;
                local_a8._5_1_ = 0;
                local_a8._M_left = &local_88;
                local_88._M_color._2_1_ = 0x62;
                local_88._M_color._0_2_ = 0x6772;
                local_a8._M_right = (_Base_ptr)0x3;
                local_88._M_color._3_1_ = _S_red >> 0x18;
                local_88._M_left = &local_68;
                local_68._M_color = 0x7466656c;
                local_88._M_right = (_Base_ptr)0x4;
                local_68._4_1_ = 0;
                __l._M_len = 7;
                __l._M_array = (iterator)local_138;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             whitelist_abi_cxx11_,__l,&local_2c1);
                lVar23 = 0;
                do {
                  pvVar3 = *(void **)((long)&local_88._M_left + lVar23);
                  if ((void *)((long)&local_68._M_color + lVar23) != pvVar3) {
                    operator_delete(pvVar3);
                  }
                  lVar23 = lVar23 + -0x20;
                } while (lVar23 != -0xe0);
                __cxa_atexit(std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::~vector,
                             &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                              whitelist_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     getTextureNameRating(std::__cxx11::string)::
                                     whitelist_abi_cxx11_);
              }
              if (((anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                   blacklist_abi_cxx11_ == '\0') &&
                 (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               getTextureNameRating(std::__cxx11::string)::
                                               blacklist_abi_cxx11_), iVar8 != 0)) {
                local_138._0_8_ = local_138 + 0x10;
                local_138._8_8_ = 5;
                local_138._16_6_ = 0x7468676972;
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)local_138;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             blacklist_abi_cxx11_,__l_00,&local_2c1);
                if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                  operator_delete((void *)local_138._0_8_);
                }
                __cxa_atexit(std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::~vector,
                             &(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                              blacklist_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     getTextureNameRating(std::__cxx11::string)::
                                     blacklist_abi_cxx11_);
              }
              lVar23 = (long)DAT_00139a30 -
                       (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                             blacklist_abi_cxx11_ >> 7;
              puVar20 = DAT_00139a30;
              puVar26 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                        blacklist_abi_cxx11_;
              if (0 < lVar23) {
                local_2c0 = DAT_00139a30;
                lVar23 = lVar23 + 1;
                puVar26 = (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                          blacklist_abi_cxx11_ + 8;
                do {
                  puVar24 = puVar26;
                  lVar21 = std::__cxx11::string::find((char *)&local_1d8,puVar24[-8],0);
                  if (lVar21 != -1) {
                    puVar20 = local_2c0;
                    puVar24 = puVar24 + -8;
                    goto LAB_0011f92c;
                  }
                  lVar21 = std::__cxx11::string::find((char *)&local_1d8,puVar24[-4],0);
                  if (lVar21 != -1) {
                    puVar20 = local_2c0;
                    puVar24 = puVar24 + -4;
                    goto LAB_0011f92c;
                  }
                  lVar21 = std::__cxx11::string::find((char *)&local_1d8,*puVar24,0);
                  puVar20 = local_2c0;
                  if (lVar21 != -1) goto LAB_0011f92c;
                  lVar21 = std::__cxx11::string::find((char *)&local_1d8,puVar24[4],0);
                  puVar20 = local_2c0;
                  if (lVar21 != -1) {
                    puVar24 = puVar24 + 4;
                    goto LAB_0011f92c;
                  }
                  lVar23 = lVar23 + -1;
                  puVar26 = puVar24 + 0x10;
                } while (1 < lVar23);
                puVar26 = puVar24 + 8;
              }
              lVar23 = (long)puVar20 - (long)puVar26 >> 5;
              if (lVar23 == 1) {
LAB_0011f907:
                lVar23 = std::__cxx11::string::find((char *)&local_1d8,*puVar26,0);
                puVar24 = puVar26;
                if (lVar23 == -1) {
                  puVar24 = puVar20;
                }
              }
              else {
                puVar24 = puVar26;
                if (lVar23 == 2) {
LAB_0011f8ce:
                  lVar23 = std::__cxx11::string::find((char *)&local_1d8,*puVar24,0);
                  if (lVar23 == -1) {
                    puVar26 = puVar24 + 4;
                    goto LAB_0011f907;
                  }
                }
                else {
                  puVar24 = puVar20;
                  if ((lVar23 == 3) &&
                     (lVar23 = std::__cxx11::string::find((char *)&local_1d8,*puVar26,0),
                     puVar24 = puVar26, lVar23 == -1)) {
                    puVar24 = puVar26 + 4;
                    goto LAB_0011f8ce;
                  }
                }
              }
LAB_0011f92c:
              lVar23 = 0;
              if (puVar24 == puVar20) {
                local_68._M_left =
                     (anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                     whitelist_abi_cxx11_;
                lVar23 = (long)DAT_00139a10 -
                         (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               whitelist_abi_cxx11_ >> 7;
                p_Var25 = DAT_00139a10;
                local_2c0 = puVar11;
                if (0 < lVar23) {
                  lVar23 = lVar23 + 1;
                  p_Var27 = DAT_00139a10;
                  do {
                    lVar21 = std::__cxx11::string::find
                                       ((char *)&local_1d8,*(ulong *)(p_Var25 + -1),0);
                    puVar11 = local_2c0;
                    if (lVar21 != -1) goto LAB_0011fac9;
                    lVar21 = std::__cxx11::string::find
                                       ((char *)&local_1d8,*(ulong *)(p_Var25 + -2),0);
                    if (lVar21 != -1) {
                      puVar11 = local_2c0;
                      p_Var27 = p_Var27 + -1;
                      goto LAB_0011fac9;
                    }
                    lVar21 = std::__cxx11::string::find
                                       ((char *)&local_1d8,*(ulong *)(p_Var25 + -3),0);
                    if (lVar21 != -1) {
                      puVar11 = local_2c0;
                      p_Var27 = p_Var27 + -2;
                      goto LAB_0011fac9;
                    }
                    lVar21 = std::__cxx11::string::find
                                       ((char *)&local_1d8,*(ulong *)(p_Var25 + -4),0);
                    if (lVar21 != -1) {
                      puVar11 = local_2c0;
                      p_Var27 = p_Var27 + -3;
                      goto LAB_0011fac9;
                    }
                    p_Var25 = p_Var25 + -4;
                    p_Var27 = p_Var27 + -4;
                    lVar23 = lVar23 + -1;
                  } while (1 < lVar23);
                }
                p_Var7 = local_68._M_left;
                puVar11 = local_2c0;
                lVar23 = (long)p_Var25 - (long)local_68._M_left >> 5;
                if (lVar23 == 1) {
LAB_0011faa5:
                  lVar23 = std::__cxx11::string::find((char *)&local_1d8,*(ulong *)(p_Var25 + -1),0)
                  ;
                  p_Var27 = p_Var7;
                  if (lVar23 != -1) {
                    p_Var27 = p_Var25;
                  }
                }
                else if (lVar23 == 2) {
LAB_0011fa5f:
                  lVar23 = std::__cxx11::string::find((char *)&local_1d8,*(ulong *)(p_Var25 + -1),0)
                  ;
                  p_Var27 = p_Var25;
                  if (lVar23 == -1) {
                    p_Var25 = p_Var25 + -1;
                    goto LAB_0011faa5;
                  }
                }
                else {
                  p_Var27 = p_Var7;
                  if ((lVar23 == 3) &&
                     (lVar23 = std::__cxx11::string::find
                                         ((char *)&local_1d8,*(ulong *)(p_Var25 + -1),0),
                     p_Var27 = p_Var25, lVar23 == -1)) {
                    p_Var25 = p_Var25 + -1;
                    goto LAB_0011fa5f;
                  }
                }
LAB_0011fac9:
                lVar23 = (long)p_Var27 -
                         (long)(anonymous_namespace)::getTextureNameRating(std::__cxx11::string)::
                               whitelist_abi_cxx11_ >> 5;
                if (lVar23 < 1) {
                  lVar23 = 0;
                }
              }
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8);
              }
              iVar8 = (int)local_280;
              if ((int)local_280 < (int)lVar23) {
                std::__cxx11::string::_M_assign((string *)local_2b0);
                local_2b8 = puVar11;
                iVar8 = (int)lVar23;
              }
            }
            else {
              iVar8 = (int)local_280;
            }
            local_280 = (char *)CONCAT44(local_280._4_4_,iVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_208);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_1b8);
        local_218 = local_218 + 1;
      } while ((local_218 <
                (ulong)((long)local_278.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
              (local_2b0->_M_string_length == 0));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  if ((char)local_2a4 != '\0') {
    if (local_2b0->_M_string_length == 0) {
      poVar12 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No texture image found",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Using texture image: ",0x15);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(local_2b0->_M_dataplus)._M_p,
                           local_2b0->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    }
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return (int)local_2b8;
}

Assistant:

int getViewImageName(std::string &image, const char *name, const char *spath,
                     bool verbose)
{
  int rating=-1;
  int ret=0;

  // get image name from specification

  std::vector<std::string> list;

  gutil::split(list, name, ',');

  image.clear();

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "i=") == 0)
    {
      image=list[i].substr(2);
      ret=1;
    }
  }

  // support format of Middlebury stereo benchmark data sets

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      long dw, dh;
      int  dd;

      getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);

      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, depthname.substr(0, pos)+"im"+depthname[pos+4]+".", "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // try to load image header and compare size to depth image

        try
        {
          long w, h;
          int  d;

          getImageIO().loadHeader(s.c_str(), w, h, d);

          int ds=(w+dw-1)/dw;
          if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
          {
            if (verbose)
            {
              std::cout << "Found suitable image: " << s << std::endl;
            }

            if (dd == 1)
            {
              image=s;
              dd=d;
              ret=ds;
            }
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }
  }

  // alternatively, search for image name

  if (image.size() == 0)
  {
    std::string depthname=list[0];
    bool tiled=false;

    size_t pos=depthname.rfind(':');

    if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
    {
      tiled=true;
    }

    long dw, dh;
    int  dd;

    getImageIO().loadHeader(depthname.c_str(), dw, dh, dd);
    dd=0;

    // go through list of prefixes

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (size_t i=0; i<list.size() && image.size() == 0; i++)
    {
      // get list of all files with that prefix

      std::set<std::string> flist;

      try
      {
        gutil::getFileList(flist, list[i], "");
      }
      catch (gutil::IOException &)
      { }

      // check list of files for images with the same size as the depth
      // image and prefer color images

      std::set<std::string> checked;
      checked.insert(depthname);

      for (std::set<std::string>::iterator it=flist.begin(); it!=flist.end(); ++it)
      {
        std::string s=*it;

        // if the depth image is a tiled image, then try to detect the
        // corresponding image as tiled

        if (tiled)
        {
          size_t pos=s.find_last_of("/\\");

          if (pos == s.npos)
          {
            pos=0;
          }

          pos=s.find('_', pos);

          if (pos != s.npos)
          {
            size_t pos2=s.rfind('_');

            if (pos2 > pos)
            {
              s=s.substr(0, pos)+":"+s.substr(pos2+1);
            }
          }
        }

        // try to load image header and compare size to depth image

        if (checked.find(s) == checked.end() &&
            s.compare(s.size()-4, 4, ".txt") != 0 &&
            s.compare(s.size()-4, 4, ".TXT") != 0)
        {
          checked.insert(s);

          try
          {
            long w, h;
            int  d;

            getImageIO().loadHeader(s.c_str(), w, h, d);

            int ds=(w+dw-1)/dw;
            if ((w+ds-1)/ds == dw && (h+ds-1)/ds == dh)
            {
              if (verbose)
              {
                std::cout << "Found suitable image: " << s << std::endl;
              }

              int r=getTextureNameRating(s.substr(list[i].size()));
              if (r > rating)
              {
                image=s;
                rating=r;
                ret=ds;
              }
            }
          }
          catch (const gutil::Exception &)
          { }
        }
      }
    }
  }

  if (verbose)
  {
    if (image.size() > 0)
    {
      std::cout << "Using texture image: " << image << std::endl;
    }
    else
    {
      std::cout << "No texture image found" << std::endl;
    }
  }

  return ret;
}